

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void err_msg<unsigned_long,unsigned_short>
               (string *msg,unsigned_long t,unsigned_short u,bool expected)

{
  ostream *poVar1;
  byte in_CL;
  string *in_RDI;
  unsigned_short in_stack_0000011e;
  unsigned_long in_stack_00000128;
  string local_68 [48];
  string local_38 [37];
  byte local_13;
  
  local_13 = in_CL & 1;
  poVar1 = std::operator<<((ostream *)&std::cerr,in_RDI);
  to_hex<unsigned_long>(in_stack_00000128);
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<unsigned_short>(in_stack_0000011e);
  poVar1 = std::operator<<(poVar1,local_68);
  poVar1 = std::operator<<(poVar1,", expected = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_13 & 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void err_msg(const std::string& msg, T t, U u, bool expected)
{
	std::cerr << msg << to_hex(t) << ", " << to_hex(u) << ", expected = " << expected << std::endl;
}